

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_pubkey_load(secp256k1_context *ctx,secp256k1_ge *ge,secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_ge_storage s;
  
  s.x.n[0] = *(uint64_t *)pubkey->data;
  s.x.n[1] = *(uint64_t *)(pubkey->data + 8);
  s.x.n[2] = *(uint64_t *)(pubkey->data + 0x10);
  s.x.n[3] = *(uint64_t *)(pubkey->data + 0x18);
  s.y.n[0] = *(uint64_t *)(pubkey->data + 0x20);
  s.y.n[1] = *(uint64_t *)(pubkey->data + 0x28);
  s.y.n[2] = *(uint64_t *)(pubkey->data + 0x30);
  s.y.n[3] = *(uint64_t *)(pubkey->data + 0x38);
  secp256k1_ge_from_storage(ge,&s);
  iVar1 = secp256k1_fe_is_zero(&ge->x);
  if (iVar1 != 0) {
    (*(ctx->illegal_callback).fn)("!secp256k1_fe_is_zero(&ge->x)",(ctx->illegal_callback).data);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

static int secp256k1_pubkey_load(const secp256k1_context* ctx, secp256k1_ge* ge, const secp256k1_pubkey* pubkey) {
    if (sizeof(secp256k1_ge_storage) == 64) {
        /* When the secp256k1_ge_storage type is exactly 64 byte, use its
         * representation inside secp256k1_pubkey, as conversion is very fast.
         * Note that secp256k1_pubkey_save must use the same representation. */
        secp256k1_ge_storage s;
        memcpy(&s, &pubkey->data[0], sizeof(s));
        secp256k1_ge_from_storage(ge, &s);
    } else {
        /* Otherwise, fall back to 32-byte big endian for X and Y. */
        secp256k1_fe x, y;
        ARG_CHECK(secp256k1_fe_set_b32_limit(&x, pubkey->data));
        ARG_CHECK(secp256k1_fe_set_b32_limit(&y, pubkey->data + 32));
        secp256k1_ge_set_xy(ge, &x, &y);
    }
    ARG_CHECK(!secp256k1_fe_is_zero(&ge->x));
    return 1;
}